

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupCones(Gia_Man_t *p,int *pPos,int nPos,int fTrimPis)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Gia_Obj_t *pGVar3;
  Vec_Ptr_t *pVVar4;
  Gia_Man_t *p_03;
  char *pcVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  p_00 = Vec_PtrAlloc(100);
  p_01 = Vec_PtrAlloc(100);
  p_02 = Vec_PtrAlloc(100);
  uVar9 = 0;
  uVar10 = 0;
  if (0 < nPos) {
    uVar10 = (ulong)(uint)nPos;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pGVar3 = Gia_ManPo(p,pPos[uVar9]);
    Vec_PtrPush(p_02,pGVar3);
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar8 = 0; iVar8 < p_02->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar8);
    Gia_ManDupCones_rec(p,pGVar3,p_00,p_01,p_02);
  }
  Vec_PtrSort(p_00,Gia_ObjCompareByCioId);
  pVVar4 = p_00;
  if (fTrimPis == 0) {
    pVVar4 = (Vec_Ptr_t *)p->vCis;
  }
  p_03 = Gia_ManStart(p_02->nSize + pVVar4->nSize + p_01->nSize + 1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_03->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_03->pSpec = pcVar5;
  p->pObjs->Value = 0;
  iVar8 = nPos;
  if (fTrimPis == 0) {
    iVar7 = 0;
    while ((iVar7 < p->vCis->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCi(p,iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ManAppendCi(p_03);
      pGVar3->Value = uVar2;
      iVar7 = iVar7 + 1;
    }
  }
  else {
    for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
      pvVar6 = Vec_PtrEntry(p_00,iVar7);
      iVar1 = Gia_ManAppendCi(p_03);
      *(int *)((long)pvVar6 + 8) = iVar1;
    }
  }
  for (; iVar8 < p_02->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar8);
    uVar2 = Gia_ManAppendCi(p_03);
    pGVar3 = Gia_ObjRiToRo(p,pGVar3);
    pGVar3->Value = uVar2;
  }
  for (iVar8 = 0; iVar8 < p_01->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_01,iVar8);
    iVar7 = Gia_ObjIsXor(pGVar3);
    iVar1 = Gia_ObjFanin0Copy(pGVar3);
    iLit1 = Gia_ObjFanin1Copy(pGVar3);
    if (iVar7 == 0) {
      uVar2 = Gia_ManAppendAnd(p_03,iVar1,iLit1);
    }
    else {
      uVar2 = Gia_ManAppendXor(p_03,iVar1,iLit1);
    }
    pGVar3->Value = uVar2;
  }
  for (iVar8 = 0; iVar8 < p_02->nSize; iVar8 = iVar8 + 1) {
    pGVar3 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar8);
    iVar7 = Gia_ObjFanin0Copy(pGVar3);
    Gia_ManAppendCo(p_03,iVar7);
  }
  Gia_ManSetRegNum(p_03,p_02->nSize - nPos);
  Vec_PtrFree(p_00);
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  return p_03;
}

Assistant:

Gia_Man_t * Gia_ManDupCones( Gia_Man_t * p, int * pPos, int nPos, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nPos; i++ )
        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( (fTrimPis ? Vec_PtrSize(vLeaves) : Gia_ManCiNum(p)) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // finalize
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}